

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfunc.cpp
# Opt level: O0

void __thiscall
trun::TestFunc::TestFunc
          (TestFunc *this,string *use_symbolName,string *use_moduleName,string *use_caseName)

{
  ILogger *pIVar1;
  shared_ptr<trun::TestResult> local_70;
  allocator<char> local_59;
  string local_58;
  string *local_28;
  string *use_caseName_local;
  string *use_moduleName_local;
  string *use_symbolName_local;
  TestFunc *this_local;
  
  local_28 = use_caseName;
  use_caseName_local = use_moduleName;
  use_moduleName_local = use_symbolName;
  use_symbolName_local = &this->symbolName;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->moduleName);
  std::__cxx11::string::string((string *)&this->caseName);
  this->state = Idle;
  this->execState = None;
  this->testScope = kUnknown;
  this->pLogger = (ILogger *)0x0;
  std::shared_ptr<trun::IDynLibrary>::shared_ptr(&this->library,(nullptr_t)0x0);
  std::vector<std::shared_ptr<trun::TestFunc>,_std::allocator<std::shared_ptr<trun::TestFunc>_>_>::
  vector(&this->dependencies);
  this->pFunc = (PTESTFUNC)0x0;
  this->testReturnCode = -1;
  std::shared_ptr<trun::TestResult>::shared_ptr(&this->testResult,(nullptr_t)0x0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->symbolName,use_moduleName_local);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->moduleName,use_caseName_local);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->caseName,local_28);
  this->testScope = kUnknown;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"TestFunc",&local_59);
  pIVar1 = gnilk::Logger::GetLogger(&local_58);
  this->pLogger = pIVar1;
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::shared_ptr<trun::TestResult>::shared_ptr(&local_70,(nullptr_t)0x0);
  std::shared_ptr<trun::TestResult>::operator=(&this->testResult,&local_70);
  std::shared_ptr<trun::TestResult>::~shared_ptr(&local_70);
  this->testReturnCode = -1;
  return;
}

Assistant:

TestFunc::TestFunc(const std::string &use_symbolName, const std::string &use_moduleName, const std::string &use_caseName) {
    symbolName = use_symbolName;
    moduleName = use_moduleName;
    caseName = use_caseName;
    testScope = kTestScope::kUnknown;
    pLogger = gnilk::Logger::GetLogger("TestFunc");
    testResult = nullptr;
    testReturnCode = -1;
}